

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::Fapply
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  FabArray<amrex::FArrayBox> *this_00;
  undefined8 *puVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  double *pdVar38;
  bool bVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fm2xm2y4z;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real fmx2y2z;
  Real fxyz;
  Real facy;
  Real facx;
  Real facz;
  MFIter mfi;
  Box local_4fc;
  double *local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double *local_4b8;
  uint local_4b0;
  int local_4ac;
  MLNodeLaplacian *local_4a8;
  ulong local_4a0;
  double *local_498;
  long local_490;
  ulong local_488;
  long local_480;
  double *local_478;
  double *local_470;
  long local_468;
  double *local_460;
  double *local_458;
  long local_450;
  long local_448;
  double *local_440;
  double *local_438;
  long local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  Array4<const_int> local_3e8;
  Array4<double> local_3a8;
  Array4<const_double> local_368;
  undefined8 *local_328;
  long local_320;
  Array4<const_double> local_318;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  long local_290;
  long local_288;
  FabArray<amrex::IArrayBox> *local_280;
  FabArray<amrex::FArrayBox> *local_278;
  FabArray<amrex::FArrayBox> *local_270;
  ulong local_268;
  ulong local_260;
  double *local_258;
  long local_250;
  long local_248;
  long local_240;
  int *local_238;
  double *local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  double *local_208;
  int *local_200;
  double *local_1f8;
  double *local_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_288 = (long)mglev;
  local_328 = (undefined8 *)
              (local_288 * 0x18 +
              *(long *)&(this->m_sigma).
                        super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                        .
                        super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              );
  local_290 = *(long *)&(this->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  lVar26 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar24 = local_288 * 200;
  dVar46 = *(double *)(lVar26 + 0x38 + lVar24);
  dVar42 = *(double *)(lVar26 + 0x40 + lVar24);
  dVar1 = *(double *)(lVar26 + 0x48 + lVar24);
  local_280 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + local_288 * 8);
  local_4a8 = this;
  local_400 = mglev;
  local_278 = &out->super_FabArray<amrex::FArrayBox>;
  local_270 = &in->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)out,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_138 = dVar46 * 0.027777777777777776 * dVar46;
    local_148 = dVar42 * 0.027777777777777776 * dVar42;
    local_128 = dVar1 * 0.027777777777777776 * dVar1;
    local_188 = local_138 + local_148 + local_128;
    uStack_180 = 0;
    local_2a8 = -local_138;
    uStack_2a0 = 0x8000000000000000;
    local_2b8 = local_148 + local_148;
    local_2c8 = local_128 + local_128;
    local_198 = (local_2b8 - local_138) + local_2c8;
    uStack_190 = 0;
    local_168 = -local_148;
    uStack_160 = 0x8000000000000000;
    local_178 = local_138 + local_138;
    local_1a8 = (local_138 * 4.0 - local_2b8) + local_128 * -2.0;
    uStack_1a0 = 0;
    uStack_130 = 0;
    local_1b8 = local_148 * 4.0 + local_138 * -2.0 + local_128 * -2.0;
    uStack_1b0 = 0;
    local_1c8 = local_128 * 4.0 + (local_138 * -2.0 - local_2b8);
    uStack_1c0 = 0;
    uStack_140 = 0;
    uStack_2c0 = 0;
    local_1d8 = (local_178 - local_148) + local_2c8;
    uStack_1d0 = 0;
    uStack_170 = 0;
    uStack_2b0 = 0;
    local_1e8 = (local_178 + local_2b8) - local_128;
    uStack_1e0 = 0;
    uStack_120 = 0;
    local_158 = -local_128;
    uStack_150 = 0x8000000000000000;
    do {
      MFIter::tilebox(&local_4fc,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_368,local_270,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_3a8,local_278,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3e8,local_280,&local_90);
      if ((local_4a8->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_318,*(FabArray<amrex::FArrayBox> **)(local_290 + local_288 * 8),&local_90)
        ;
        local_498 = (double *)CONCAT44(local_498._4_4_,local_4fc.bigend.vect[2]);
        if (local_4fc.smallend.vect[2] <= local_4fc.bigend.vect[2]) {
          local_470 = (double *)(ulong)(uint)local_4fc.bigend.vect[0];
          local_488 = (ulong)(uint)local_4fc.bigend.vect[1];
          local_478 = (double *)(long)local_4fc.smallend.vect[0];
          local_498 = (double *)CONCAT44(local_498._4_4_,local_4fc.bigend.vect[2] + 1U);
          local_468 = CONCAT44(local_468._4_4_,local_4fc.smallend.vect[1]);
          local_480 = CONCAT44(local_480._4_4_,local_4fc.bigend.vect[1] + 1U);
          uVar36 = local_4fc.smallend.vect[2];
          do {
            if (local_4fc.smallend.vect[1] <= local_4fc.bigend.vect[1]) {
              iVar19 = uVar36 - 1;
              local_430 = CONCAT44(local_430._4_4_,iVar19);
              local_448 = (long)local_3e8.begin.y;
              local_440 = (double *)
                          (local_3e8.p +
                          ((long)(int)uVar36 - (long)local_3e8.begin.z) * local_3e8.kstride);
              local_450 = local_3e8.jstride;
              local_458 = (double *)(long)local_3a8.begin.y;
              local_460 = (double *)local_3a8.jstride;
              local_438 = local_3a8.p +
                          ((long)(int)uVar36 - (long)local_3a8.begin.z) * local_3a8.kstride;
              local_490 = CONCAT44(local_490._4_4_,uVar36 + 1);
              iVar22 = local_4fc.smallend.vect[1];
              do {
                if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
                  lVar33 = (iVar22 - local_368.begin.y) * local_368.jstride;
                  lVar34 = (int)(uVar36 - local_368.begin.z) * local_368.kstride;
                  lVar29 = (iVar22 - local_318.begin.y) * local_318.jstride;
                  lVar24 = ((iVar22 + -1) - local_318.begin.y) * local_318.jstride;
                  local_428 = (double)CONCAT44(local_428._4_4_,iVar22 + 1);
                  lVar26 = ((iVar22 + -1) - local_368.begin.y) * local_368.jstride;
                  lVar30 = (int)(uVar36 - local_318.begin.z) * local_318.kstride;
                  local_4b8 = local_368.p + ((iVar22 + 1) - local_368.begin.y) * local_368.jstride;
                  local_4c0 = (double)((iVar19 - local_318.begin.z) * local_318.kstride);
                  local_410 = (double)((iVar19 - local_368.begin.z) * local_368.kstride);
                  local_420 = (double)((int)((uVar36 + 1) - local_368.begin.z) * local_368.kstride);
                  local_4d8 = (double)(local_318.nstride * 7);
                  local_4e0 = (double *)(long)local_368.begin.x;
                  local_4d0 = (double)(long)local_318.begin.x;
                  local_408 = (double)(local_318.nstride * 2);
                  local_2d8 = (double)(local_318.nstride * 4);
                  local_4c8 = (double)local_318.nstride;
                  local_418 = (double)(local_318.nstride * 5);
                  pdVar38 = local_478;
                  do {
                    if (*(int *)((long)local_440 +
                                ((long)pdVar38 - (long)local_3e8.begin.x) * 4 +
                                (iVar22 - local_448) * local_3e8.jstride * 4) == 0) {
                      lVar27 = -1 - (long)local_4e0;
                      lVar32 = -1 - (long)local_4d0;
                      lVar31 = (long)(((int)pdVar38 + 1) - local_368.begin.x);
                      pdVar20 = local_318.p + (long)pdVar38 + lVar29 + (lVar30 - (long)local_4d0);
                      dVar46 = local_4b8[lVar31 + (long)local_420] * pdVar20[local_318.nstride * 7]
                               + local_4b8[(long)pdVar38 + (long)local_420 + lVar27] *
                                 local_318.p
                                 [(long)pdVar38 + lVar29 + lVar30 + local_318.nstride * 7 + lVar32]
                                 + local_368.p[lVar26 + lVar31 + (long)local_420] *
                                   local_318.p
                                   [(long)pdVar38 +
                                    lVar24 + ((lVar30 + local_318.nstride * 7) - (long)local_4d0)] +
                                   local_368.p[(long)pdVar38 + lVar26 + (long)local_420 + lVar27] *
                                   local_318.p
                                   [(long)pdVar38 + lVar24 + lVar30 + local_318.nstride * 7 + lVar32
                                   ] + local_4b8[lVar31 + (long)local_410] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + (((long)local_4c0 + local_318.nstride * 7) -
                                                 (long)local_4d0)] +
                                       local_4b8[(long)pdVar38 + (long)local_410 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + (long)local_4c0 + local_318.nstride * 7 + lVar32] +
                                       local_368.p[lVar26 + lVar31 + (long)local_410] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar24 + (((long)local_4c0 + local_318.nstride * 7) -
                                                 (long)local_4d0)] +
                                       local_368.p
                                       [(long)pdVar38 + lVar26 + (long)local_410 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar24 + (long)local_4c0 + local_318.nstride * 7 + lVar32] +
                                       local_4b8[(long)pdVar38 + ((long)local_420 - (long)local_4e0)
                                                ] * pdVar20[local_318.nstride * 6] +
                                       local_368.p
                                       [(long)pdVar38 + lVar26 + ((long)local_420 - (long)local_4e0)
                                       ] * local_318.p
                                           [(long)pdVar38 +
                                            lVar24 + ((lVar30 + local_318.nstride * 6) -
                                                     (long)local_4d0)] +
                                       local_4b8[(long)pdVar38 + ((long)local_410 - (long)local_4e0)
                                                ] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + (((long)local_4c0 + local_318.nstride * 6) -
                                                 (long)local_4d0)] +
                                       local_368.p
                                       [(long)pdVar38 + lVar26 + ((long)local_410 - (long)local_4e0)
                                       ] * local_318.p
                                           [(long)pdVar38 +
                                            lVar24 + (((long)local_4c0 + local_318.nstride * 6) -
                                                     (long)local_4d0)] +
                                       local_368.p[lVar33 + lVar31 + (long)local_420] *
                                       pdVar20[local_318.nstride * 5] +
                                       local_368.p
                                       [(long)pdVar38 + lVar33 + (long)local_420 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + lVar30 + local_318.nstride * 5 + lVar32] +
                                       local_368.p[lVar33 + lVar31 + (long)local_410] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + (((long)local_4c0 + local_318.nstride * 5) -
                                                 (long)local_4d0)] +
                                       local_368.p
                                       [(long)pdVar38 + lVar33 + (long)local_410 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + (long)local_4c0 + local_318.nstride * 5 + lVar32] +
                                       local_4b8[lVar31 + lVar34] * pdVar20[local_318.nstride * 4] +
                                       local_4b8[(long)pdVar38 + lVar34 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar29 + lVar30 + local_318.nstride * 4 + lVar32] +
                                       local_368.p[lVar26 + lVar31 + lVar34] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar24 + ((lVar30 + local_318.nstride * 4) - (long)local_4d0
                                                 )] +
                                       local_368.p[(long)pdVar38 + lVar26 + lVar34 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar24 + lVar30 + local_318.nstride * 4 + lVar32] +
                                       local_368.p
                                       [(long)pdVar38 + lVar33 + ((long)local_420 - (long)local_4e0)
                                       ] * pdVar20[local_318.nstride * 3] +
                                       local_368.p
                                       [(long)pdVar38 + lVar33 + ((long)local_410 - (long)local_4e0)
                                       ] * local_318.p
                                           [(long)pdVar38 +
                                            lVar29 + (((long)local_4c0 + local_318.nstride * 3) -
                                                     (long)local_4d0)] +
                                       local_4b8[(long)pdVar38 + (lVar34 - (long)local_4e0)] *
                                       pdVar20[local_318.nstride * 2] +
                                       local_368.p
                                       [(long)pdVar38 + lVar26 + (lVar34 - (long)local_4e0)] *
                                       local_318.p
                                       [(long)pdVar38 +
                                        lVar24 + ((lVar30 + local_318.nstride * 2) - (long)local_4d0
                                                 )] +
                                       local_368.p[lVar33 + lVar31 + lVar34] *
                                       pdVar20[local_318.nstride] +
                                       local_368.p
                                       [(long)pdVar38 + lVar33 + (lVar34 - (long)local_4e0)] *
                                       *pdVar20 +
                                       local_368.p[(long)pdVar38 + lVar33 + lVar34 + lVar27] *
                                       local_318.p
                                       [(long)pdVar38 + lVar29 + lVar30 + local_318.nstride + lVar32
                                       ];
                    }
                    else {
                      dVar46 = 0.0;
                    }
                    pdVar20 = (double *)((long)pdVar38 + 1);
                    local_438[(long)pdVar38 +
                              (((long)iVar22 - (long)local_458) * local_3a8.jstride -
                              (long)local_3a8.begin.x)] = dVar46;
                    pdVar38 = pdVar20;
                  } while ((int)pdVar20 != local_4fc.bigend.vect[0] + 1U);
                }
                iVar22 = iVar22 + 1;
              } while (iVar22 != local_4fc.bigend.vect[1] + 1U);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != local_4fc.bigend.vect[2] + 1U);
        }
      }
      else {
        this_00 = (FabArray<amrex::FArrayBox> *)*local_328;
        if (this_00 == (FabArray<amrex::FArrayBox> *)0x0) {
          if (local_4fc.smallend.vect[2] <= local_4fc.bigend.vect[2]) {
            dVar46 = local_4a8->m_const_sigma;
            uVar36 = local_4fc.smallend.vect[2];
            do {
              if (local_4fc.smallend.vect[1] <= local_4fc.bigend.vect[1]) {
                iVar22 = local_4fc.smallend.vect[1];
                do {
                  if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
                    lVar34 = (iVar22 - local_368.begin.y) * local_368.jstride;
                    lVar24 = (int)(uVar36 - local_368.begin.z) * local_368.kstride;
                    lVar29 = (~local_368.begin.y + iVar22) * local_368.jstride;
                    lVar33 = ((iVar22 + 1) - local_368.begin.y) * local_368.jstride;
                    lVar27 = (int)(~local_368.begin.z + uVar36) * local_368.kstride;
                    lVar30 = (int)((uVar36 + 1) - local_368.begin.z) * local_368.kstride;
                    lVar26 = (long)local_4fc.smallend.vect[0];
                    do {
                      if (local_3e8.p
                          [((long)(int)uVar36 - (long)local_3e8.begin.z) * local_3e8.kstride +
                           ((long)iVar22 - (long)local_3e8.begin.y) * local_3e8.jstride +
                           (lVar26 - local_3e8.begin.x)] == 0) {
                        lVar35 = (long)(~local_368.begin.x + (int)lVar26);
                        lVar32 = (long)(((int)lVar26 + 1) - local_368.begin.x);
                        lVar31 = lVar26 - local_368.begin.x;
                        dVar42 = ((local_368.p[lVar34 + lVar31 + lVar27] * 4.0 +
                                  local_368.p[lVar34 + lVar31 + lVar30] * 4.0) * local_1c8 +
                                 (local_368.p[lVar29 + lVar31 + lVar24] * 4.0 +
                                 local_368.p[lVar33 + lVar31 + lVar24] * 4.0) * local_1b8 +
                                 (local_368.p[lVar34 + lVar35 + lVar24] * 4.0 +
                                 local_368.p[lVar34 + lVar32 + lVar24] * 4.0) * local_1a8 +
                                 (local_368.p[lVar33 + lVar32 + lVar24] +
                                  local_368.p[lVar33 + lVar32 + lVar24] +
                                 local_368.p[lVar33 + lVar35 + lVar24] +
                                 local_368.p[lVar33 + lVar35 + lVar24] +
                                 local_368.p[lVar29 + lVar35 + lVar24] +
                                 local_368.p[lVar29 + lVar35 + lVar24] +
                                 local_368.p[lVar29 + lVar32 + lVar24] +
                                 local_368.p[lVar29 + lVar32 + lVar24]) * local_1e8 +
                                 (local_368.p[lVar34 + lVar32 + lVar30] +
                                  local_368.p[lVar34 + lVar32 + lVar30] +
                                 local_368.p[lVar34 + lVar35 + lVar30] +
                                 local_368.p[lVar34 + lVar35 + lVar30] +
                                 local_368.p[lVar34 + lVar35 + lVar27] +
                                 local_368.p[lVar34 + lVar35 + lVar27] +
                                 local_368.p[lVar34 + lVar32 + lVar27] +
                                 local_368.p[lVar34 + lVar32 + lVar27]) * local_1d8 +
                                 (local_368.p[lVar33 + lVar31 + lVar30] +
                                  local_368.p[lVar33 + lVar31 + lVar30] +
                                 local_368.p[lVar29 + lVar31 + lVar30] +
                                 local_368.p[lVar29 + lVar31 + lVar30] +
                                 local_368.p[lVar29 + lVar31 + lVar27] +
                                 local_368.p[lVar29 + lVar31 + lVar27] +
                                 local_368.p[lVar33 + lVar31 + lVar27] +
                                 local_368.p[lVar33 + lVar31 + lVar27]) * local_198 +
                                 local_368.p[lVar34 + lVar31 + lVar24] * -4.0 * local_188 * 8.0 +
                                 (local_368.p[lVar29 + lVar35 + lVar27] +
                                  local_368.p[lVar29 + lVar32 + lVar27] +
                                  local_368.p[lVar33 + lVar35 + lVar27] +
                                  local_368.p[lVar33 + lVar32 + lVar27] +
                                  local_368.p[lVar29 + lVar35 + lVar30] +
                                  local_368.p[lVar29 + lVar32 + lVar30] +
                                  local_368.p[lVar33 + lVar35 + lVar30] +
                                 local_368.p[lVar33 + lVar32 + lVar30]) * local_188) * dVar46;
                      }
                      else {
                        dVar42 = 0.0;
                      }
                      lVar32 = lVar26 + 1;
                      local_3a8.p
                      [((long)(int)uVar36 - (long)local_3a8.begin.z) * local_3a8.kstride +
                       ((long)iVar22 - (long)local_3a8.begin.y) * local_3a8.jstride +
                       (lVar26 - local_3a8.begin.x)] = dVar42;
                      lVar26 = lVar32;
                    } while ((int)lVar32 != local_4fc.bigend.vect[0] + 1U);
                  }
                  iVar22 = iVar22 + 1;
                } while (iVar22 != local_4fc.bigend.vect[1] + 1U);
              }
              bVar39 = uVar36 != local_4fc.bigend.vect[2];
              uVar36 = uVar36 + 1;
            } while (bVar39);
          }
        }
        else if (((local_400 < 1) || (local_4a8->m_use_harmonic_average == false)) &&
                (local_4a8->m_use_mapped != true)) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_318,this_00,&local_90)
          ;
          local_4e0 = (double *)CONCAT44(local_4e0._4_4_,local_4fc.bigend.vect[2]);
          if (local_4fc.smallend.vect[2] <= local_4fc.bigend.vect[2]) {
            local_4c0 = (double)(ulong)(uint)local_4fc.bigend.vect[0];
            local_4d0 = (double)(ulong)(uint)local_4fc.bigend.vect[1];
            local_4e0 = (double *)CONCAT44(local_4e0._4_4_,local_4fc.bigend.vect[2] + 1U);
            local_4b8 = (double *)CONCAT44(local_4b8._4_4_,local_4fc.smallend.vect[1]);
            local_4c8 = (double)CONCAT44(local_4c8._4_4_,local_4fc.bigend.vect[1] + 1U);
            uVar36 = local_4fc.smallend.vect[2];
            do {
              if (local_4fc.smallend.vect[1] <= local_4fc.bigend.vect[1]) {
                iVar22 = local_4fc.smallend.vect[1];
                do {
                  if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
                    lVar34 = (iVar22 - local_368.begin.y) * local_368.jstride;
                    lVar35 = ((iVar22 + -1) - local_318.begin.y) * local_318.jstride;
                    lVar29 = (iVar22 - local_318.begin.y) * local_318.jstride;
                    lVar33 = (int)((uVar36 - 1) - local_318.begin.z) * local_318.kstride;
                    lVar30 = (int)(uVar36 - local_318.begin.z) * local_318.kstride;
                    lVar24 = ((iVar22 + -1) - local_368.begin.y) * local_368.jstride;
                    lVar27 = ((iVar22 + 1) - local_368.begin.y) * local_368.jstride;
                    lVar31 = (int)(uVar36 - local_368.begin.z) * local_368.kstride;
                    lVar37 = (int)((uVar36 - 1) - local_368.begin.z) * local_368.kstride;
                    lVar32 = (int)((uVar36 + 1) - local_368.begin.z) * local_368.kstride;
                    lVar26 = (long)local_4fc.smallend.vect[0];
                    do {
                      if (local_3e8.p
                          [((long)(int)uVar36 - (long)local_3e8.begin.z) * local_3e8.kstride +
                           ((long)iVar22 - (long)local_3e8.begin.y) * local_3e8.jstride +
                           (lVar26 - local_3e8.begin.x)] == 0) {
                        lVar28 = lVar26 - local_368.begin.x;
                        lVar21 = (lVar26 + -1) - (long)local_318.begin.x;
                        dVar46 = local_318.p[lVar35 + lVar21 + lVar33];
                        lVar25 = lVar26 - local_318.begin.x;
                        dVar42 = local_318.p[lVar35 + lVar25 + lVar33];
                        dVar43 = dVar46 + dVar42;
                        dVar1 = local_318.p[lVar29 + lVar21 + lVar33];
                        dVar2 = local_318.p[lVar29 + lVar25 + lVar33];
                        dVar41 = dVar43 + dVar1 + dVar2;
                        dVar3 = local_318.p[lVar35 + lVar21 + lVar30];
                        dVar4 = local_318.p[lVar35 + lVar25 + lVar30];
                        dVar5 = local_318.p[lVar29 + lVar21 + lVar30];
                        dVar6 = local_318.p[lVar29 + lVar25 + lVar30];
                        lVar25 = (lVar26 + -1) - (long)local_368.begin.x;
                        lVar21 = (long)(((int)lVar26 + 1) - local_368.begin.x);
                        dVar46 = (dVar41 * local_368.p[lVar34 + lVar28 + lVar37] +
                                 (dVar3 + dVar4 + dVar5 + dVar6) *
                                 local_368.p[lVar34 + lVar28 + lVar32]) * local_1c8 +
                                 ((dVar43 + dVar3 + dVar4) * local_368.p[lVar24 + lVar28 + lVar31] +
                                 (dVar1 + dVar2 + dVar5 + dVar6) *
                                 local_368.p[lVar27 + lVar28 + lVar31]) * local_1b8 +
                                 ((dVar46 + dVar1 + dVar3 + dVar5) *
                                  local_368.p[lVar34 + lVar25 + lVar31] +
                                 (dVar42 + dVar2 + dVar4 + dVar6) *
                                 local_368.p[lVar34 + lVar21 + lVar31]) * local_1a8 +
                                 ((dVar2 + dVar6) * local_368.p[lVar27 + lVar21 + lVar31] +
                                 (dVar1 + dVar5) * local_368.p[lVar27 + lVar25 + lVar31] +
                                 (dVar46 + dVar3) * local_368.p[lVar24 + lVar25 + lVar31] +
                                 (dVar42 + dVar4) * local_368.p[lVar24 + lVar21 + lVar31]) *
                                 local_1e8 +
                                 ((dVar4 + dVar6) * local_368.p[lVar34 + lVar21 + lVar32] +
                                 (dVar3 + dVar5) * local_368.p[lVar34 + lVar25 + lVar32] +
                                 local_368.p[lVar34 + lVar25 + lVar37] * (dVar46 + dVar1) +
                                 local_368.p[lVar34 + lVar21 + lVar37] * (dVar42 + dVar2)) *
                                 local_1d8 +
                                 ((dVar5 + dVar6) * local_368.p[lVar27 + lVar28 + lVar32] +
                                 local_368.p[lVar24 + lVar28 + lVar32] * (dVar3 + dVar4) +
                                 local_368.p[lVar24 + lVar28 + lVar37] * dVar43 +
                                 local_368.p[lVar27 + lVar28 + lVar37] * (dVar1 + dVar2)) *
                                 local_198 +
                                 (local_368.p[lVar27 + lVar21 + lVar32] * dVar6 +
                                 local_368.p[lVar27 + lVar25 + lVar32] * dVar5 +
                                 local_368.p[lVar24 + lVar21 + lVar32] * dVar4 +
                                 local_368.p[lVar24 + lVar25 + lVar32] * dVar3 +
                                 local_368.p[lVar27 + lVar21 + lVar37] * dVar2 +
                                 local_368.p[lVar27 + lVar25 + lVar37] * dVar1 +
                                 local_368.p[lVar24 + lVar25 + lVar37] * dVar46 +
                                 local_368.p[lVar24 + lVar21 + lVar37] * dVar42) * local_188 +
                                 (dVar41 + dVar3 + dVar4 + dVar5 + dVar6) *
                                 local_368.p[lVar34 + lVar28 + lVar31] * -4.0 * local_188;
                      }
                      else {
                        dVar46 = 0.0;
                      }
                      lVar21 = lVar26 + 1;
                      local_3a8.p
                      [((long)(int)uVar36 - (long)local_3a8.begin.z) * local_3a8.kstride +
                       ((long)iVar22 - (long)local_3a8.begin.y) * local_3a8.jstride +
                       (lVar26 - local_3a8.begin.x)] = dVar46;
                      lVar26 = lVar21;
                    } while ((int)lVar21 != local_4fc.bigend.vect[0] + 1U);
                  }
                  iVar22 = iVar22 + 1;
                } while (iVar22 != local_4fc.bigend.vect[1] + 1U);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != local_4fc.bigend.vect[2] + 1U);
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_318,this_00,&local_90)
          ;
          puVar18 = local_328;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_d0,(FabArray<amrex::FArrayBox> *)local_328[1],&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_110,(FabArray<amrex::FArrayBox> *)puVar18[2],&local_90);
          local_4a0 = (ulong)(uint)local_4fc.smallend.vect[2];
          local_4b0 = local_4fc.bigend.vect[2];
          if (local_4fc.smallend.vect[2] <= local_4fc.bigend.vect[2]) {
            local_260 = (ulong)(uint)local_4fc.bigend.vect[0];
            local_268 = (ulong)(uint)local_4fc.bigend.vect[1];
            local_320 = (long)local_4fc.smallend.vect[0];
            local_3ec = local_4fc.bigend.vect[0] + 1;
            local_3fc = local_4fc.bigend.vect[1] + 1;
            local_4b0 = local_4fc.bigend.vect[2] + 1;
            local_3f8 = local_4fc.smallend.vect[1];
            do {
              iVar22 = (int)local_4a0;
              if (local_4fc.smallend.vect[1] <= local_4fc.bigend.vect[1]) {
                local_3f4 = iVar22 + -1;
                local_3f0 = iVar22 + 1;
                local_240 = (long)local_3e8.begin.y;
                local_238 = local_3e8.p +
                            ((long)iVar22 - (long)local_3e8.begin.z) * local_3e8.kstride;
                local_248 = local_3e8.jstride;
                local_490 = (long)local_3a8.begin.x;
                local_250 = (long)local_3a8.begin.y;
                local_258 = (double *)local_3a8.jstride;
                local_230 = local_3a8.p +
                            ((long)iVar22 - (long)local_3a8.begin.z) * local_3a8.kstride;
                iVar19 = local_4fc.smallend.vect[1];
                do {
                  if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
                    iVar23 = iVar19 + -1;
                    local_4ac = iVar19 + 1;
                    local_430 = (local_3f4 - local_318.begin.z) * local_318.kstride;
                    local_438 = local_318.p + (iVar23 - local_318.begin.y) * local_318.jstride;
                    local_440 = local_318.p + (iVar19 - local_318.begin.y) * local_318.jstride;
                    local_448 = (iVar22 - local_318.begin.z) * local_318.kstride;
                    local_450 = (local_3f4 - local_d0.begin.z) * local_d0.kstride;
                    local_458 = local_d0.p + (iVar23 - local_d0.begin.y) * local_d0.jstride;
                    local_460 = local_d0.p + (iVar19 - local_d0.begin.y) * local_d0.jstride;
                    local_468 = (iVar22 - local_d0.begin.z) * local_d0.kstride;
                    local_470 = local_110.p + (iVar23 - local_110.begin.y) * local_110.jstride;
                    local_478 = local_110.p + (iVar19 - local_110.begin.y) * local_110.jstride;
                    local_480 = (local_3f4 - local_110.begin.z) * local_110.kstride;
                    local_488 = (iVar22 - local_110.begin.z) * local_110.kstride;
                    local_498 = local_368.p + (iVar19 - local_368.begin.y) * local_368.jstride;
                    local_1f0 = local_368.p + (iVar23 - local_368.begin.y) * local_368.jstride;
                    local_1f8 = local_368.p + (local_4ac - local_368.begin.y) * local_368.jstride;
                    lVar24 = (iVar22 - local_368.begin.z) * local_368.kstride;
                    lVar29 = (local_3f4 - local_368.begin.z) * local_368.kstride;
                    lVar30 = (local_3f0 - local_368.begin.z) * local_368.kstride;
                    local_200 = local_238 + (iVar19 - local_240) * local_3e8.jstride;
                    local_208 = local_230 + (iVar19 - local_250) * local_3a8.jstride;
                    local_210 = (long)local_368.begin.x;
                    local_218 = (long)local_318.begin.x;
                    local_220 = (long)local_d0.begin.x;
                    local_228 = (long)local_110.begin.x;
                    lVar26 = local_320;
                    do {
                      if (local_200[lVar26 - local_3e8.begin.x] == 0) {
                        lVar33 = lVar26 + -1;
                        lVar34 = lVar33 - local_218;
                        dVar46 = local_438[lVar34 + local_430];
                        lVar27 = lVar26 - local_218;
                        local_408 = local_438[lVar27 + local_430];
                        dVar40 = dVar46 + local_408;
                        dVar42 = local_440[lVar34 + local_430];
                        dVar1 = local_440[lVar27 + local_430];
                        local_4b8 = (double *)(dVar40 + dVar42 + dVar1);
                        dVar2 = local_438[lVar34 + local_448];
                        dVar3 = local_438[lVar27 + local_448];
                        dVar4 = local_440[lVar34 + local_448];
                        dVar5 = local_440[lVar27 + local_448];
                        lVar34 = lVar33 - local_220;
                        dVar6 = local_458[lVar34 + local_450];
                        lVar27 = lVar26 - local_220;
                        dVar41 = local_458[lVar27 + local_450];
                        dVar44 = dVar6 + dVar41;
                        dVar43 = local_460[lVar34 + local_450];
                        dVar7 = local_460[lVar27 + local_450];
                        local_4c0 = dVar44 + dVar43 + dVar7;
                        dVar8 = local_458[lVar34 + local_468];
                        dVar9 = local_458[lVar27 + local_468];
                        dVar10 = local_460[lVar34 + local_468];
                        dVar11 = local_460[lVar27 + local_468];
                        lVar34 = lVar33 - local_228;
                        lVar27 = lVar26 - local_228;
                        dVar12 = local_470[lVar34 + local_480];
                        local_4d0 = local_470[lVar27 + local_480];
                        dVar45 = dVar12 + local_4d0;
                        dVar13 = local_478[lVar34 + local_480];
                        dVar14 = local_478[lVar27 + local_480];
                        local_4c8 = dVar45 + dVar13 + dVar14;
                        local_428 = local_470[lVar34 + local_488];
                        dVar15 = local_470[lVar27 + local_488];
                        dVar16 = local_478[lVar34 + local_488];
                        dVar17 = local_478[lVar27 + local_488];
                        lVar27 = lVar26 - local_210;
                        local_4e0 = local_498 + lVar27;
                        lVar33 = lVar33 - local_210;
                        lVar34 = (long)(((int)lVar26 + 1) - local_368.begin.x);
                        local_2d8 = (local_128 * dVar17 + local_138 * dVar5 + local_148 * dVar11) *
                                    local_1f8[lVar34 + lVar30] +
                                    (local_128 * dVar16 + local_138 * dVar4 + local_148 * dVar10) *
                                    local_1f8[lVar33 + lVar30] +
                                    (local_128 * dVar15 + local_138 * dVar3 + local_148 * dVar9) *
                                    local_1f0[lVar34 + lVar30] +
                                    (local_128 * local_428 + local_138 * dVar2 + local_148 * dVar8)
                                    * local_1f0[lVar33 + lVar30] +
                                    (local_128 * dVar14 + local_138 * dVar1 + local_148 * dVar7) *
                                    local_1f8[lVar34 + lVar29] +
                                    (local_128 * dVar13 + local_138 * dVar42 + local_148 * dVar43) *
                                    local_1f8[lVar33 + lVar29] +
                                    (local_128 * dVar12 + local_138 * dVar46 + local_148 * dVar6) *
                                    local_1f0[lVar33 + lVar29] +
                                    (local_128 * local_4d0 +
                                    local_138 * local_408 + local_148 * dVar41) *
                                    local_1f0[lVar34 + lVar29] +
                                    ((local_4c8 + local_428 + dVar15 + dVar16 + dVar17) * local_128
                                    + ((double)local_4b8 + dVar2 + dVar3 + dVar4 + dVar5) *
                                      local_138 +
                                      (local_4c0 + dVar8 + dVar9 + dVar10 + dVar11) * local_148) *
                                    local_4e0[lVar24] * -4.0;
                        uStack_2d0 = uStack_120;
                        local_418 = dVar2 + dVar4;
                        local_4d8 = dVar2 + dVar3 + dVar4;
                        local_420 = dVar6 + dVar43 + dVar8 + dVar10;
                        local_410 = dVar43 + dVar7 + dVar10;
                        dVar46 = ((local_428 + dVar15 + dVar16 + dVar17) * local_2c8 +
                                 (local_4d8 + dVar5) * local_2a8 +
                                 (dVar8 + dVar9 + dVar10 + dVar11) * local_168) *
                                 (local_4e0[lVar30] + local_4e0[lVar30]) +
                                 (local_4c8 * local_2c8 +
                                 (double)local_4b8 * local_2a8 + local_4c0 * local_168) *
                                 (local_4e0[lVar29] + local_4e0[lVar29]) +
                                 ((dVar13 + dVar14 + dVar16 + dVar17) * local_158 +
                                 (dVar42 + dVar1 + dVar4 + dVar5) * local_2a8 +
                                 (local_410 + dVar11) * local_2b8) *
                                 (local_1f8[lVar27 + lVar24] + local_1f8[lVar27 + lVar24]) +
                                 ((dVar45 + local_428 + dVar15) * local_158 +
                                 (dVar40 + dVar2 + dVar3) * local_2a8 +
                                 (dVar44 + dVar8 + dVar9) * local_2b8) *
                                 (local_1f0[lVar27 + lVar24] + local_1f0[lVar27 + lVar24]) +
                                 ((local_4d0 + dVar14 + dVar15 + dVar17) * local_158 +
                                 (local_408 + dVar1 + dVar3 + dVar5) * local_178 +
                                 (dVar41 + dVar7 + dVar9 + dVar11) * local_168) *
                                 (local_498[lVar34 + lVar24] + local_498[lVar34 + lVar24]) +
                                 ((dVar12 + dVar13 + local_428 + dVar16) * local_158 +
                                 (dVar46 + dVar42 + dVar2 + dVar4) * local_178 +
                                 local_420 * local_168) *
                                 (local_498[lVar33 + lVar24] + local_498[lVar33 + lVar24]) +
                                 ((dVar14 + dVar17) * local_158 +
                                 (dVar1 + dVar5) * local_178 + (dVar7 + dVar11) * local_2b8) *
                                 local_1f8[lVar34 + lVar24] +
                                 ((dVar13 + dVar16) * local_158 +
                                 (dVar42 + dVar4) * local_178 + (dVar43 + dVar10) * local_2b8) *
                                 local_1f8[lVar33 + lVar24] +
                                 ((local_4d0 + dVar15) * local_158 +
                                 (local_408 + dVar3) * local_178 + (dVar41 + dVar9) * local_2b8) *
                                 local_1f0[lVar34 + lVar24] +
                                 ((dVar12 + local_428) * local_158 +
                                 (dVar46 + dVar2) * local_178 + (dVar6 + dVar8) * local_2b8) *
                                 local_1f0[lVar33 + lVar24] +
                                 ((dVar15 + dVar17) * local_2c8 +
                                 (dVar3 + dVar5) * local_178 + (dVar9 + dVar11) * local_168) *
                                 local_498[lVar34 + lVar30] +
                                 ((local_428 + dVar16) * local_2c8 +
                                 local_418 * local_178 + (dVar8 + dVar10) * local_168) *
                                 local_498[lVar33 + lVar30] +
                                 (local_2c8 * (local_4d0 + dVar14) +
                                 local_178 * (local_408 + dVar1) + (dVar41 + dVar7) * local_168) *
                                 local_498[lVar34 + lVar29] +
                                 (local_2c8 * (dVar12 + dVar13) +
                                 local_178 * (dVar46 + dVar42) + (dVar6 + dVar43) * local_168) *
                                 local_498[lVar33 + lVar29] +
                                 ((dVar16 + dVar17) * local_2c8 +
                                 (dVar4 + dVar5) * local_2a8 + (dVar10 + dVar11) * local_2b8) *
                                 local_1f8[lVar27 + lVar30] +
                                 (local_2c8 * (local_428 + dVar15) +
                                 local_2a8 * (dVar2 + dVar3) + local_2b8 * (dVar8 + dVar9)) *
                                 local_1f0[lVar27 + lVar30] +
                                 (local_2c8 * dVar45 + local_2a8 * dVar40 + local_2b8 * dVar44) *
                                 local_1f0[lVar27 + lVar29] +
                                 (local_2c8 * (dVar13 + dVar14) +
                                 local_2a8 * (dVar42 + dVar1) + local_2b8 * (dVar43 + dVar7)) *
                                 local_1f8[lVar27 + lVar29] + local_2d8;
                      }
                      else {
                        dVar46 = 0.0;
                      }
                      lVar33 = lVar26 + 1;
                      local_208[lVar26 - local_490] = dVar46;
                      lVar26 = lVar33;
                    } while ((int)lVar33 != local_3ec);
                  }
                  iVar19 = iVar19 + 1;
                } while (iVar19 != local_3fc);
              }
              local_4a0 = (ulong)(iVar22 + 1U);
            } while (iVar22 + 1U != local_4b0);
          }
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLNodeLaplacian::Fapply()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];


#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto xarr_ma = in.const_arrays();
        auto yarr_ma = out.arrays();
        auto dmskarr_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto stenarr_ma = stencil->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_sten(i,j,k,xarr_ma[box_no],stenarr_ma[box_no],dmskarr_ma[box_no]);
            });
        }
        else if (sigma[0] == nullptr)
        {
            Real const_sigma = m_const_sigma;
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               dxinvarr);
#endif
            });
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real const> const& xarr = in.const_array(mfi);
            Array4<Real> const& yarr = out.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_sten(i,j,k,xarr,stenarr,dmskarr);
                });
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, dxinvarr);
                });
#endif
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   dxinvarr);
                });
#endif
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, dxinvarr);
                });
#endif
           }
        }
    }
}